

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O3

Connection __thiscall
QObject::connectImpl
          (QObject *this,QObject *sender,void **signal,QObject *receiver,void **slot,
          QSlotObjectBase *slotObjRaw,ConnectionType type,int *types,QMetaObject *senderMetaObject)

{
  QMetaObject *pQVar1;
  QSlotObjectBase *slotObjRaw_00;
  int iVar2;
  undefined4 extraout_var;
  char *pcVar3;
  long in_FS_OFFSET;
  int signal_index;
  QMessageLogger local_70;
  QSlotObjectBase *local_50;
  int *local_48;
  void **local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = slotObjRaw;
  if (signal == (void **)0x0) {
    lcConnect();
    if (((byte)lcConnect::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0) {
      local_70.context.version = 2;
      local_70.context._4_8_ = 0;
      local_70.context._12_8_ = 0;
      local_70.context.function._4_4_ = 0;
      local_70.context.category = lcConnect::category.name;
      QMessageLogger::warning(&local_70,"QObject::connect: invalid nullptr parameter");
    }
    QMetaObject::Connection::Connection((Connection *)this);
  }
  else {
    local_48 = &signal_index;
    signal_index = -1;
    local_40 = signal;
    if (senderMetaObject != (QMetaObject *)0x0) {
      do {
        QMetaObject::static_metacall(senderMetaObject,IndexOfMethod,0,&local_48);
        slotObjRaw_00 = local_50;
        if (-1 < signal_index) {
          if ((signal_index < (int)(senderMetaObject->d).data[0xd]) ||
             (senderMetaObject = (senderMetaObject->d).superdata.direct,
             senderMetaObject != (QMetaObject *)0x0)) {
            iVar2 = 0;
            for (pQVar1 = (senderMetaObject->d).superdata.direct; pQVar1 != (QMetaObject *)0x0;
                pQVar1 = (pQVar1->d).superdata.direct) {
              iVar2 = iVar2 + (pQVar1->d).data[0xd];
            }
            signal_index = signal_index + iVar2;
            local_50 = (QSlotObjectBase *)0x0;
            QObjectPrivate::connectImpl
                      ((QObjectPrivate *)this,sender,signal_index,receiver,slot,slotObjRaw_00,type,
                       types,senderMetaObject);
            goto LAB_002b78cf;
          }
          break;
        }
        senderMetaObject = (senderMetaObject->d).superdata.direct;
      } while (senderMetaObject != (QMetaObject *)0x0);
    }
    lcConnect();
    if (((byte)lcConnect::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0) {
      local_70.context.version = 2;
      local_70.context._4_8_ = 0;
      local_70.context._12_8_ = 0;
      local_70.context.function._4_4_ = 0;
      local_70.context.category = lcConnect::category.name;
      iVar2 = (**sender->_vptr_QObject)(sender);
      pcVar3 = QMetaObject::className((QMetaObject *)CONCAT44(extraout_var,iVar2));
      QMessageLogger::warning(&local_70,"QObject::connect: signal not found in %s",pcVar3);
    }
    this->_vptr_QObject = (_func_int **)0x0;
  }
LAB_002b78cf:
  if (local_50 != (QSlotObjectBase *)0x0) {
    QtPrivate::QSlotObjectBase::Deleter::operator()((Deleter *)&local_50,local_50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (Connection)this;
}

Assistant:

QMetaObject::Connection QObject::connectImpl(const QObject *sender, void **signal,
                                             const QObject *receiver, void **slot,
                                             QtPrivate::QSlotObjectBase *slotObjRaw, Qt::ConnectionType type,
                                             const int *types, const QMetaObject *senderMetaObject)
{
    QtPrivate::SlotObjUniquePtr slotObj(slotObjRaw);
    if (!signal) {
        qCWarning(lcConnect, "QObject::connect: invalid nullptr parameter");
        return QMetaObject::Connection();
    }

    int signal_index = -1;
    void *args[] = { &signal_index, signal };
    for (; senderMetaObject && signal_index < 0; senderMetaObject = senderMetaObject->superClass()) {
        senderMetaObject->static_metacall(QMetaObject::IndexOfMethod, 0, args);
        if (signal_index >= 0 && signal_index < QMetaObjectPrivate::get(senderMetaObject)->signalCount)
            break;
    }
    if (!senderMetaObject) {
        qCWarning(lcConnect, "QObject::connect: signal not found in %s", sender->metaObject()->className());
        return QMetaObject::Connection(nullptr);
    }
    signal_index += QMetaObjectPrivate::signalOffset(senderMetaObject);
    return QObjectPrivate::connectImpl(sender, signal_index, receiver, slot, slotObj.release(), type, types, senderMetaObject);
}